

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O0

int Ivy_ManCheckChoices(Ivy_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Ivy_Obj_t *pObj_00;
  int local_24;
  Ivy_Obj_t *pIStack_20;
  int i;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  local_24 = 0;
  do {
    iVar3 = Vec_PtrSize(p->pHaig->vObjs);
    if (iVar3 <= local_24) {
      return 1;
    }
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->pHaig->vObjs,local_24);
    if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar3 = Ivy_ObjRefs(pObj_00), iVar3 != 0)) {
      iVar3 = Ivy_IsComplement(pObj_00->pEquiv);
      if (iVar3 != 0) {
        __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCheck.c"
                      ,0x108,"int Ivy_ManCheckChoices(Ivy_Man_t *)");
      }
      for (pIStack_20 = pObj_00->pEquiv; pIStack_20 != (Ivy_Obj_t *)0x0 && pIStack_20 != pObj_00;
          pIStack_20 = Ivy_Regular(pIStack_20->pEquiv)) {
        iVar3 = Ivy_ObjRefs(pIStack_20);
        if (1 < iVar3) {
          uVar1 = pObj_00->Id;
          uVar2 = pIStack_20->Id;
          uVar4 = Ivy_ObjRefs(pIStack_20);
          printf("Node %d has member %d in its equiv class with %d fanouts.\n",(ulong)uVar1,
                 (ulong)uVar2,(ulong)uVar4);
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Ivy_ManCheckChoices( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj, * pTemp;
    int i;
    Ivy_ManForEachObj( p->pHaig, pObj, i )
    {
        if ( Ivy_ObjRefs(pObj) == 0 )
            continue;
        // count the number of nodes in the loop
        assert( !Ivy_IsComplement(pObj->pEquiv) );
        for ( pTemp = pObj->pEquiv; pTemp && pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            if ( Ivy_ObjRefs(pTemp) > 1 )
                printf( "Node %d has member %d in its equiv class with %d fanouts.\n", pObj->Id, pTemp->Id, Ivy_ObjRefs(pTemp) );
    }
    return 1;
}